

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSettingsInstallHandler(ImGuiContext *context)

{
  ImGuiID IVar1;
  ImGuiSettingsHandler local_58;
  
  local_58.WriteAllFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
  local_58.UserData = (void *)0x0;
  local_58.ReadLineFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
  local_58.ApplyAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_58.ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_58.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
  local_58.TypeHash = 0;
  local_58._12_4_ = 0;
  local_58.ClearAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_58.TypeName = "Table";
  IVar1 = ImHashStr("Table",0,0);
  local_58.TypeHash = IVar1;
  local_58.ClearAllFn = TableSettingsHandler_ClearAll;
  local_58.ReadOpenFn = TableSettingsHandler_ReadOpen;
  local_58.ReadLineFn = TableSettingsHandler_ReadLine;
  local_58.ApplyAllFn = TableSettingsHandler_ApplyAll;
  local_58.WriteAllFn = TableSettingsHandler_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_back(&context->SettingsHandlers,&local_58);
  return;
}

Assistant:

void ImGui::TableSettingsInstallHandler(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Table";
    ini_handler.TypeHash = ImHashStr("Table");
    ini_handler.ClearAllFn = TableSettingsHandler_ClearAll;
    ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = TableSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}